

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::onConfigChanged(Network *this)

{
  Config *in_stack_00000020;
  Config *in_stack_00000028;
  Network *in_stack_00000030;
  
  onConfigChanged(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

void xmrig::Network::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->pools() == previousConfig->pools() || !config->pools().active()) {
        return;
    }

    m_strategy->stop();

    config->pools().print();

    delete m_strategy;
    m_strategy = config->pools().createStrategy(this);
    connect();
}